

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::SparsemaxLoss::forward_impl
          (SparsemaxLoss *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs
          ,Tensor *fx)

{
  float *pfVar1;
  long lVar2;
  uint uVar3;
  const_reference ppTVar4;
  size_type sVar5;
  runtime_error *this_00;
  long in_RDX;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>_>_>
  *in_RDI;
  float fVar6;
  float fVar7;
  uint i_1;
  float x_s;
  uint i;
  float tau_sq;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> sm;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  Tensor tsm;
  float tau;
  float t;
  uint k;
  float maxsum;
  float sum;
  float *zs;
  float qprop;
  uint qsupport_size;
  float *y;
  int rows;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<float,_float,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>_>
  *in_stack_fffffffffffffd68;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  Tensor *in_stack_fffffffffffffd80;
  Scalar *in_stack_fffffffffffffd88;
  DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
  *in_stack_fffffffffffffd90;
  Tensor *this_01;
  float *other;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  uint uVar8;
  uint local_48;
  float local_40;
  
  ppTVar4 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                      (in_RSI,0);
  uVar3 = Dim::cols(&(*ppTVar4)->d);
  if (uVar3 != 1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"SparsemaxLoss not yet implemented for multiple columns");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  ppTVar4 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                      (in_RSI,0);
  uVar3 = Dim::rows(&(*ppTVar4)->d);
  if ((int)uVar3 < 0x10001) {
    pfVar1 = *(float **)(in_RDX + 0x28);
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x68));
    fVar6 = 1.0 / (float)(sVar5 & 0xffffffff);
    lVar2 = *(long *)(in_RDI + 0x48);
    ppTVar4 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                        (in_RSI,0);
    other = (*ppTVar4)->v;
    ppTVar4 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                        (in_RSI,0);
    std::partial_sort_copy<float*,float*,std::greater<float>>
              (other,(*ppTVar4)->v + (int)uVar3,lVar2,lVar2 + (long)(int)uVar3 * 4);
    local_40 = 0.0;
    local_48 = 0;
    while ((local_48 < uVar3 &&
           (fVar7 = local_40 + *(float *)(lVar2 + (ulong)local_48 * 4),
           fVar7 < (float)(local_48 + 1) * *(float *)(lVar2 + (ulong)local_48 * 4) + 1.0))) {
      local_48 = local_48 + 1;
      local_40 = fVar7;
    }
    fVar7 = (local_40 + -1.0) / (float)local_48;
    this_01 = (Tensor *)0x0;
    std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](in_RSI,0);
    Tensor::Tensor(in_stack_fffffffffffffd80,
                   (Dim *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                   (float *)in_stack_fffffffffffffd70);
    std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
              (in_RSI,(size_type)this_01);
    Tensor::operator*(this_01);
    Tensor::operator*(this_01);
    Eigen::DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::Ones
              (CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
               (Index)in_stack_fffffffffffffd70);
    Eigen::
    MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,-1,0,-1,-1>>>
    ::operator*((MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>
                 *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                (float *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
    operator-((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
               *)this_01,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>_>
               *)in_stack_fffffffffffffd90);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>_>_>
    ::cwiseMax(in_RDI,other);
    Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>::operator=
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    *pfVar1 = 0.0;
    for (uVar8 = 0; uVar8 < uVar3; uVar8 = uVar8 + 1) {
      in_stack_fffffffffffffd90 =
           (DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            *)Eigen::
              DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
              ::operator()(in_stack_fffffffffffffd90,(Index)in_stack_fffffffffffffd88,
                           (Index)in_stack_fffffffffffffd80);
      if ((*(float *)in_stack_fffffffffffffd90 != 0.0) || (NAN(*(float *)in_stack_fffffffffffffd90))
         ) {
        in_stack_fffffffffffffd88 =
             Eigen::
             DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
             ::operator()(in_stack_fffffffffffffd90,(Index)in_stack_fffffffffffffd88,
                          (Index)in_stack_fffffffffffffd80);
        *pfVar1 = *in_stack_fffffffffffffd88 * *in_stack_fffffffffffffd88 + -(fVar7 * fVar7) +
                  *pfVar1;
      }
    }
    *pfVar1 = *pfVar1 * 0.5;
    *pfVar1 = (fVar6 * fVar6 * (float)(sVar5 & 0xffffffff)) / 2.0 + *pfVar1;
    for (uVar3 = 0; uVar3 < (uint)sVar5; uVar3 = uVar3 + 1) {
      fVar7 = fVar6;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x68),
                 (ulong)uVar3);
      in_stack_fffffffffffffd80 =
           (Tensor *)
           Eigen::
           DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
           ::operator()(in_stack_fffffffffffffd90,(Index)in_stack_fffffffffffffd88,
                        (Index)in_stack_fffffffffffffd80);
      *pfVar1 = -fVar7 * (float)(in_stack_fffffffffffffd80->d).d[0] + *pfVar1;
    }
    if (*pfVar1 <= 0.0 && *pfVar1 != 0.0) {
      *pfVar1 = 0.0;
    }
    Tensor::~Tensor((Tensor *)0x607d5c);
    return;
  }
  std::operator<<((ostream *)&std::cerr,
                  "MAX_SPARSEMAX_LOSS_ROWS is not sufficient. Recompile with larger value.\n");
  abort();
}

Assistant:

void SparsemaxLoss::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
  if (xs[0]->d.cols() == 1) {
#if HAVE_CUDA
    throw std::runtime_error("SparsemaxLoss not implemented on GPU");
#else
    const int rows = xs[0]->d.rows();
    if (rows > MAX_SPARSEMAX_LOSS_ROWS) {
      cerr << "MAX_SPARSEMAX_LOSS_ROWS is not sufficient. Recompile with larger value.\n";
      abort();
    }
    float& y = fx.v[0];  // loss
    const unsigned qsupport_size = pq->size();
    const float qprop = 1.f / qsupport_size;

    float *zs = static_cast<float*>(aux_mem);
    std::partial_sort_copy(xs[0]->v, xs[0]->v+rows, zs, zs + rows, std::greater<float>());
    float sum = 0, maxsum = 0;
    unsigned k = 0;
    for (k = 0; k < rows; ++k) {
      sum += zs[k];
      float t = 1 + (k + 1) * zs[k];
      if (t <= sum) break;
      maxsum = sum;
    }
    float tau = (maxsum - 1) / k;
    Tensor tsm(xs[0]->d, (float*)aux_mem);
    auto x = **xs[0];
    auto sm = *tsm;
    sm = (x - Eigen::MatrixXf::Ones(rows, 1)*tau).cwiseMax(0.f);
    //cerr << "SpM: " << (sm).transpose() << " |||";
    //for (unsigned i = 0; i < pq->size(); ++i) cerr << ' ' << (*pq)[i];
    //cerr << endl;
    y = 0;
    float tau_sq = tau * tau;
    for (unsigned i = 0; i < rows; ++i) {
      if (sm(i, 0)) {
        const float x_s = x(i, 0);
        y += x_s * x_s - tau_sq;
      }
    }
    y /= 2;
    y += qprop * qprop * qsupport_size / 2;
    for (unsigned i = 0; i < qsupport_size; ++i)
      y -= qprop * x((*pq)[i], 0);
    if (y < 0) y = 0;
#endif
  } else {
    throw std::runtime_error("SparsemaxLoss not yet implemented for multiple columns");
  }
}